

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O1

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::hashSlow
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint64_t seed)

{
  size_t len;
  XXH64_hash_t XVar1;
  
  len = (size_t)"\x01\x01"[**(byte **)this];
  if (len == 0) {
    len = byteSizeDynamic(this,*(byte **)this);
  }
  XVar1 = VELOCYPACK_XXH64(*(void **)this,len,seed);
  return XVar1;
}

Assistant:

inline uint64_t hashSlow(uint64_t seed = defaultSeed64) const {
    std::size_t const size = checkOverflow(byteSize());
    return VELOCYPACK_HASH(start(), size, seed);
  }